

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::LRNParameter::LRNParameter(LRNParameter *this,LRNParameter *from)

{
  void *pvVar1;
  float fVar2;
  int iVar3;
  uint32 uVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LRNParameter_0071e010;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  fVar2 = from->k_;
  this->beta_ = from->beta_;
  this->k_ = fVar2;
  iVar3 = from->engine_;
  uVar4 = from->local_size_;
  fVar2 = from->alpha_;
  this->norm_region_ = from->norm_region_;
  this->engine_ = iVar3;
  this->local_size_ = uVar4;
  this->alpha_ = fVar2;
  return;
}

Assistant:

LRNParameter::LRNParameter(const LRNParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&norm_region_, &from.norm_region_,
    reinterpret_cast<char*>(&k_) -
    reinterpret_cast<char*>(&norm_region_) + sizeof(k_));
  // @@protoc_insertion_point(copy_constructor:caffe.LRNParameter)
}